

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O3

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::HasBitIndex
          (ReflectionSchema *this,FieldDescriptor *field)

{
  LogMessage *other;
  long *plVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->has_bits_offset_ == -1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.h"
               ,0xa0);
    other = LogMessage::operator<<(&local_50,"CHECK failed: HasHasbits(): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  if (field[0x50] == (FieldDescriptor)0x0) {
    plVar1 = (long *)(*(long *)(field + 0x58) + 0x30);
  }
  else if (*(long *)(field + 0x68) == 0) {
    plVar1 = (long *)(*(long *)(field + 0x30) + 0x98);
  }
  else {
    plVar1 = (long *)(*(long *)(field + 0x68) + 0x80);
  }
  return this->has_bit_indices_[(int)((ulong)((long)field - *plVar1) >> 3) * 0x3cf3cf3d];
}

Assistant:

uint32 HasBitIndex(const FieldDescriptor* field) const {
    GOOGLE_DCHECK(HasHasbits());
    return has_bit_indices_[field->index()];
  }